

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::AddFixed32(UnknownFieldSet *this,int number,uint32_t value)

{
  pointer pUVar1;
  
  pUVar1 = RepeatedField<google::protobuf::UnknownField>::Add(&this->fields_);
  pUVar1->number_ = number;
  pUVar1->type_ = 1;
  (pUVar1->data_).fixed32 = value;
  return;
}

Assistant:

void UnknownFieldSet::AddFixed32(int number, uint32_t value) {
  auto& field = *fields_.Add();
  field.number_ = number;
  field.SetType(UnknownField::TYPE_FIXED32);
  field.data_.fixed32 = value;
}